

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_allow_multiple(void)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  int32_t *piVar5;
  char *multiple_json;
  _Bool allow_multiple;
  bson_t bson;
  bson_json_reader_t *reader_multiple;
  bson_json_reader_t *reader;
  bson_error_t error;
  int32_t one;
  undefined4 local_380;
  undefined4 local_37c;
  undefined1 local_378;
  long local_2a8;
  long local_2a0;
  undefined1 local_298 [516];
  uint local_94 [35];
  
  memset(&local_380,0,0x80);
  local_380 = 3;
  local_37c = 5;
  local_378 = 5;
  local_2a0 = bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,0);
  local_2a8 = bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,1);
  if (local_2a0 == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x33,"test_bson_json_allow_multiple","reader");
    abort();
  }
  if (local_2a8 == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x34,"test_bson_json_allow_multiple","reader_multiple");
    abort();
  }
  iVar2 = bson_json_reader_read(local_2a0,&local_380,local_298);
  pFVar1 = _stderr;
  if (iVar2 != 1) {
    uVar3 = bson_json_reader_read(local_2a0,&local_380,local_298);
    fprintf(pFVar1,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",1,"==",(ulong)uVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x38,"test_bson_json_allow_multiple");
    abort();
  }
  uVar4 = bson_bcone_magic();
  piVar5 = bcon_ensure_int32_ptr((int32_t *)local_94);
  bcon_extract(&local_380,"a",uVar4,0xf,piVar5,0);
  if (local_94[0] != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",1,"==",(ulong)local_94[0],
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x3a,"test_bson_json_allow_multiple");
    abort();
  }
  bson_reinit(&local_380);
  iVar2 = bson_json_reader_read(local_2a0,&local_380,local_298);
  pFVar1 = _stderr;
  if (iVar2 != 1) {
    uVar3 = bson_json_reader_read(local_2a0,&local_380,local_298);
    fprintf(pFVar1,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",1,"==",(ulong)uVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x3e,"test_bson_json_allow_multiple");
    abort();
  }
  uVar4 = bson_bcone_magic();
  piVar5 = bcon_ensure_int32_ptr((int32_t *)local_94);
  bcon_extract(&local_380,"b",uVar4,0xf,piVar5,0);
  if (local_94[0] != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",1,"==",(ulong)local_94[0],
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x40,"test_bson_json_allow_multiple");
    abort();
  }
  bson_reinit(&local_380);
  iVar2 = bson_json_reader_read(local_2a0,&local_380,local_298);
  pFVar1 = _stderr;
  if (iVar2 != 1) {
    uVar3 = bson_json_reader_read(local_2a0,&local_380,local_298);
    fprintf(pFVar1,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",1,"==",(ulong)uVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x44,"test_bson_json_allow_multiple");
    abort();
  }
  uVar4 = bson_bcone_magic();
  piVar5 = bcon_ensure_int32_ptr((int32_t *)local_94);
  bcon_extract(&local_380,"a",uVar4,0xf,piVar5,0);
  if (local_94[0] != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",1,"==",(ulong)local_94[0],
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x46,"test_bson_json_allow_multiple");
    abort();
  }
  bson_reinit(&local_380);
  iVar2 = bson_json_reader_read(local_2a8,&local_380,local_298);
  pFVar1 = _stderr;
  if (iVar2 != 1) {
    uVar3 = bson_json_reader_read(local_2a8,&local_380,local_298);
    fprintf(pFVar1,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",1,"==",(ulong)uVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x4c,"test_bson_json_allow_multiple");
    abort();
  }
  uVar4 = bson_bcone_magic();
  piVar5 = bcon_ensure_int32_ptr((int32_t *)local_94);
  bcon_extract(&local_380,"a",uVar4,0xf,piVar5,0);
  if (local_94[0] != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",1,"==",(ulong)local_94[0],
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x4e,"test_bson_json_allow_multiple");
    abort();
  }
  bson_reinit(&local_380);
  iVar2 = bson_json_reader_read(local_2a8,&local_380,local_298);
  pFVar1 = _stderr;
  if (iVar2 != 1) {
    uVar3 = bson_json_reader_read(local_2a8,&local_380,local_298);
    fprintf(pFVar1,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",1,"==",(ulong)uVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x53,"test_bson_json_allow_multiple");
    abort();
  }
  uVar4 = bson_bcone_magic();
  piVar5 = bcon_ensure_int32_ptr((int32_t *)local_94);
  bcon_extract(&local_380,"b",uVar4,0xf,piVar5,0);
  if (local_94[0] != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",1,"==",(ulong)local_94[0],
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x55,"test_bson_json_allow_multiple");
    abort();
  }
  bson_reinit(&local_380);
  iVar2 = bson_json_reader_read(local_2a8,&local_380,local_298);
  pFVar1 = _stderr;
  if (iVar2 != 1) {
    uVar3 = bson_json_reader_read(local_2a8,&local_380,local_298);
    fprintf(pFVar1,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",1,"==",(ulong)uVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x5a,"test_bson_json_allow_multiple");
    abort();
  }
  uVar4 = bson_bcone_magic();
  piVar5 = bcon_ensure_int32_ptr((int32_t *)local_94);
  bcon_extract(&local_380,"a",uVar4,0xf,piVar5,0);
  if (local_94[0] != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",1,"==",(ulong)local_94[0],
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x5c,"test_bson_json_allow_multiple");
    abort();
  }
  bson_json_reader_destroy(local_2a0);
  bson_json_reader_destroy(local_2a8);
  bson_destroy(&local_380);
  return;
}

Assistant:

static void
test_bson_json_allow_multiple (void)
{
   int32_t one;
   bson_error_t error;
   bson_json_reader_t *reader;
   bson_json_reader_t *reader_multiple;
   bson_t bson = BSON_INITIALIZER;
   bool allow_multiple = true;
   char *multiple_json = "{\"a\": 1}{\"b\": 1}";

   reader = bson_json_reader_new (
      multiple_json, &test_bson_json_read_cb_helper, NULL, !allow_multiple, 0);
   reader_multiple = bson_json_reader_new (
      multiple_json, &test_bson_json_read_cb_helper, NULL, allow_multiple, 0);
   BSON_ASSERT (reader);
   BSON_ASSERT (reader_multiple);

   /* reader with allow_multiple false */
   /* read first json */
   ASSERT_CMPINT (1, ==, bson_json_reader_read (reader, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* read second json */
   bson_reinit (&bson);
   ASSERT_CMPINT (1, ==, bson_json_reader_read (reader, &bson, &error));
   BCON_EXTRACT (&bson, "b", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* start at the beginning of the string */
   bson_reinit (&bson);
   ASSERT_CMPINT (1, ==, bson_json_reader_read (reader, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* reader_multiple with allow_multiple true */
   /* read first json */
   bson_reinit (&bson);
   ASSERT_CMPINT (
      1, ==, bson_json_reader_read (reader_multiple, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* read second json */
   bson_reinit (&bson);
   ASSERT_CMPINT (
      1, ==, bson_json_reader_read (reader_multiple, &bson, &error));
   BCON_EXTRACT (&bson, "b", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* start at the beginning of the string */
   bson_reinit (&bson);
   ASSERT_CMPINT (
      1, ==, bson_json_reader_read (reader_multiple, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   bson_json_reader_destroy (reader);
   bson_json_reader_destroy (reader_multiple);
   bson_destroy (&bson);
}